

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPServer.cpp
# Opt level: O3

void __thiscall UDPServer::on_upload(UDPServer *this,Poll *poll,Complex *complex)

{
  int *piVar1;
  _Atomic_word *p_Var2;
  pointer pcVar3;
  long lVar4;
  SharedDirectory *this_00;
  uint64_t uVar5;
  ulong *puVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined4 uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  element_type *this_01;
  undefined8 uVar11;
  bool bVar12;
  int iVar13;
  long *plVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  long *plVar16;
  Complex ok;
  shared_ptr<TCPServer> tcp;
  string file_name;
  string nil;
  undefined1 local_239;
  undefined1 local_238 [32];
  undefined1 *local_218;
  ulong local_210;
  undefined1 uStack_208;
  undefined7 uStack_207;
  element_type *local_200;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1f8;
  element_type *local_1f0;
  _Any_data local_1e8;
  _Manager_type local_1d8;
  code *pcStack_1d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  TCPServer *local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0;
  string local_1a8;
  _Any_data local_188;
  undefined1 local_178;
  undefined7 uStack_177;
  UDPServer *local_168;
  _Manager_type *local_160;
  undefined8 local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  code *pcStack_148;
  shared_ptr<Alarm> local_140;
  shared_ptr<Subscriber> local_130;
  long *local_120;
  long local_118;
  long local_110 [2];
  Poll *local_100;
  string local_f8;
  path local_d8;
  undefined1 local_b8 [24];
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  pcVar3 = (complex->payload)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,pcVar3,pcVar3 + (complex->payload)._M_string_length);
  bVar12 = SharedDirectory::can_create_file
                     ((this->dir).super___shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(complex->header).param,&local_1a8);
  local_168 = this;
  if (!bVar12) {
    uVar5 = (complex->header).cmd_seq;
    local_120 = local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"NO_WAY","");
    local_1e8._M_unused._M_object = &local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,local_120,local_118 + (long)local_120);
    local_238._16_2_ = 0;
    local_238._24_2_ = SUB82(&local_210,0);
    local_238._26_2_ = (undefined2)((ulong)&local_210 >> 0x10);
    local_238._28_4_ = (undefined4)((ulong)&local_210 >> 0x20);
    local_218 = (undefined1 *)0x0;
    local_210 = local_210 & 0xffffffffffffff00;
    local_238._0_8_ = (pointer)0x0;
    local_238._10_2_ = 0;
    local_238._12_4_ = 0;
    local_238[8] = '\0';
    local_238[9] = '\0';
    std::__cxx11::string::operator=((string *)(local_238 + 0x18),(string *)&local_1a8);
    uVar11 = local_1e8._M_unused._0_8_;
    strcpy(local_238,(char *)local_1e8._M_unused._0_8_);
    local_238._10_2_ = (undefined2)uVar5;
    local_238._12_4_ = (undefined4)(uVar5 >> 0x10);
    local_238._16_2_ = (undefined2)(uVar5 >> 0x30);
    if ((_Manager_type *)uVar11 != &local_1d8) {
      operator_delete((void *)uVar11,(ulong)(local_1d8 + 1));
    }
    if (local_120 != local_110) {
      operator_delete(local_120,local_110[0] + 1);
    }
    local_b8._16_2_ = local_238._16_2_;
    local_b8._10_2_ = local_238._10_2_;
    local_b8[8] = local_238[8];
    local_b8[9] = local_238[9];
    local_b8._0_4_ = local_238._0_4_;
    local_b8._4_4_ = local_238._4_4_;
    local_b8._12_4_ = local_238._12_4_;
    lVar4 = CONCAT44(local_238._28_4_,CONCAT22(local_238._26_2_,local_238._24_2_));
    local_a0._M_p = (pointer)&local_90;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a0,lVar4,local_218 + lVar4);
    respond<dto::Simple>(local_168,poll,(Simple *)local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_p != &local_90) {
      operator_delete(local_a0._M_p,local_90._M_allocated_capacity + 1);
    }
    puVar6 = (ulong *)CONCAT44(local_238._28_4_,CONCAT22(local_238._26_2_,local_238._24_2_));
    if (puVar6 != &local_210) {
      operator_delete(puVar6,local_210 + 1);
    }
    goto LAB_00124c49;
  }
  SharedDirectory::reserve_file
            ((this->dir).super___shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_1a8,(complex->header).param);
  local_1f0 = (this->dir).super___shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1c0 = (this->dir).super___shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
    }
  }
  local_1e8._M_unused._M_object = &local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"FileUploadServer-","");
  plVar14 = (long *)std::__cxx11::string::_M_append
                              (local_1e8._M_pod_data,(ulong)local_1a8._M_dataplus._M_p);
  plVar16 = plVar14 + 2;
  if ((long *)*plVar14 == plVar16) {
    local_238._20_4_ = *(undefined4 *)((long)plVar14 + 0x14);
    local_238._28_4_ = *(undefined4 *)((long)plVar14 + 0x1c);
    local_238._16_2_ = (undefined2)(int)*plVar16;
    local_238._18_2_ = (undefined2)((uint)(int)*plVar16 >> 0x10);
    local_238._24_2_ = (undefined2)(int)plVar14[3];
    local_238._26_2_ = (undefined2)((uint)(int)plVar14[3] >> 0x10);
    local_238._0_8_ = local_238 + 0x10;
  }
  else {
    lVar4 = *plVar16;
    local_238._16_2_ = (undefined2)lVar4;
    local_238._18_2_ = (undefined2)((ulong)lVar4 >> 0x10);
    local_238._20_4_ = (undefined4)((ulong)lVar4 >> 0x20);
    local_238._0_8_ = (long *)*plVar14;
  }
  lVar4 = plVar14[1];
  local_238._8_2_ = (undefined2)lVar4;
  local_238._10_2_ = (undefined2)((ulong)lVar4 >> 0x10);
  local_238._12_4_ = (undefined4)((ulong)lVar4 >> 0x20);
  *plVar14 = (long)plVar16;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  this_00 = (this->dir).super___shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_1a8._M_dataplus._M_p,
             local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
  SharedDirectory::path_in_dir(&local_d8,this_00,&local_f8);
  FileReceiveSession::create_session_factory((SessionFactory *)&local_188,&local_d8);
  local_1b8 = (TCPServer *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TCPServer,std::allocator<TCPServer>,std::__cxx11::string,std::function<std::shared_ptr<Subscriber>(Poll&,TCPServer&,sockaddr_in)>>
            (&local_1b0,&local_1b8,(allocator<TCPServer> *)&local_239,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
             (function<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in)> *)&local_188)
  ;
  if ((code *)CONCAT71(uStack_177,local_178) != (code *)0x0) {
    (*(code *)CONCAT71(uStack_177,local_178))(&local_188,&local_188,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.m_pathname._M_dataplus._M_p != &local_d8.m_pathname.field_2) {
    operator_delete(local_d8.m_pathname._M_dataplus._M_p,
                    local_d8.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  p_Var10 = local_1c0;
  if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
    operator_delete((void *)local_238._0_8_,
                    CONCAT44(local_238._20_4_,CONCAT22(local_238._18_2_,local_238._16_2_)) + 1);
  }
  if ((_Manager_type *)local_1e8._M_unused._0_8_ != &local_1d8) {
    operator_delete(local_1e8._M_unused._M_object,(ulong)(local_1d8 + 1));
  }
  local_130.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1b8->super_Subscriber;
  local_130.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_1b0._M_pi;
  if (local_1b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1b0._M_pi)->_M_use_count = (local_1b0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1b0._M_pi)->_M_use_count = (local_1b0._M_pi)->_M_use_count + 1;
    }
  }
  Poll::subscribe(poll,&local_130);
  if (local_130.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_1c8 = local_1b0._M_pi;
  if (local_1b0._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar13 = this->timeout;
    local_238._8_2_ = 0;
    local_238._10_2_ = 0;
    local_238._12_4_ = 0;
  }
  else {
    local_238._8_2_ = SUB82(local_1b0._M_pi,0);
    local_238._10_2_ = (undefined2)((ulong)local_1b0._M_pi >> 0x10);
    local_238._12_4_ = (undefined4)((ulong)local_1b0._M_pi >> 0x20);
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1b0._M_pi)->_M_weak_count = (local_1b0._M_pi)->_M_weak_count + 1;
      UNLOCK();
      iVar13 = this->timeout;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1b0._M_pi)->_M_weak_count = (local_1b0._M_pi)->_M_weak_count + 1;
        UNLOCK();
        goto LAB_00124792;
      }
    }
    else {
      (local_1b0._M_pi)->_M_weak_count = (local_1b0._M_pi)->_M_weak_count + 1;
      iVar13 = this->timeout;
    }
    (local_1b0._M_pi)->_M_weak_count = (local_1b0._M_pi)->_M_weak_count + 1;
  }
LAB_00124792:
  local_238._0_8_ = local_1b8;
  local_238._16_2_ = SUB82(poll,0);
  local_238._18_2_ = (undefined2)((ulong)poll >> 0x10);
  local_238._20_4_ = (undefined4)((ulong)poll >> 0x20);
  local_238._24_2_ = SUB82(&local_210,0);
  uVar7 = local_238._24_2_;
  local_238._26_2_ = (undefined2)((ulong)&local_210 >> 0x10);
  uVar8 = local_238._26_2_;
  local_238._28_4_ = (undefined4)((ulong)&local_210 >> 0x20);
  uVar9 = local_238._28_4_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_238 + 0x18),local_1a8._M_dataplus._M_p,
             local_1a8._M_dataplus._M_p + local_1a8._M_string_length);
  local_200 = local_1f0;
  p_Stack_1f8 = p_Var10;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
    }
  }
  p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var15->_M_use_count = 1;
  p_Var15->_M_weak_count = 1;
  p_Var15->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001397a0;
  local_1e8._8_8_ = 0;
  local_1f0 = (element_type *)p_Var15;
  local_1e8._M_unused._M_object = operator_new(0x48);
  p_Var10 = p_Stack_1f8;
  *(undefined8 *)local_1e8._M_unused._0_8_ = local_238._0_8_;
  *(ulong *)((long)local_1e8._M_unused._0_8_ + 8) =
       CONCAT44(local_238._12_4_,CONCAT22(local_238._10_2_,local_238._8_2_));
  local_238._0_8_ = (pointer)0x0;
  local_238._8_2_ = 0;
  local_238._10_2_ = 0;
  local_238._12_4_ = 0;
  *(ulong *)((long)local_1e8._M_unused._0_8_ + 0x10) =
       CONCAT44(local_238._20_4_,CONCAT22(local_238._18_2_,local_238._16_2_));
  *(code **)((long)local_1e8._M_unused._0_8_ + 0x18) =
       (code *)((long)local_1e8._M_unused._0_8_ + 0x28);
  puVar6 = (ulong *)CONCAT44(local_238._28_4_,CONCAT22(local_238._26_2_,local_238._24_2_));
  if (puVar6 == &local_210) {
    *(ulong *)((long)local_1e8._M_unused._0_8_ + 0x28) = local_210;
    *(ulong *)((long)local_1e8._M_unused._0_8_ + 0x30) = CONCAT71(uStack_207,uStack_208);
  }
  else {
    *(ulong **)((long)local_1e8._M_unused._0_8_ + 0x18) = puVar6;
    *(ulong *)((long)local_1e8._M_unused._0_8_ + 0x28) = local_210;
  }
  *(undefined1 **)((long)local_1e8._M_unused._0_8_ + 0x20) = local_218;
  local_218 = (undefined1 *)0x0;
  local_210 = local_210 & 0xffffffffffffff00;
  p_Stack_1f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)((long)local_1e8._M_unused._0_8_ + 0x38) = local_200;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_1e8._M_unused._0_8_ + 0x40) =
       p_Var10;
  local_200 = (element_type *)0x0;
  pcStack_1d0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/samvel1024[P]dist-fs/src/UDPServer.cpp:190:56)>
                ::_M_invoke;
  local_1d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/samvel1024[P]dist-fs/src/UDPServer.cpp:190:56)>
              ::_M_manager;
  local_238._24_2_ = uVar7;
  local_238._26_2_ = uVar8;
  local_238._28_4_ = uVar9;
  Alarm::Alarm((Alarm *)(p_Var15 + 1),(long)(iVar13 * 1000),(function<void_()> *)&local_1e8);
  if (local_1d8 != (_Manager_type)0x0) {
    (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
  }
  if (p_Stack_1f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f8);
  }
  puVar6 = (ulong *)CONCAT44(local_238._28_4_,CONCAT22(local_238._26_2_,local_238._24_2_));
  if (puVar6 != &local_210) {
    operator_delete(puVar6,local_210 + 1);
  }
  plVar14 = (long *)CONCAT44(local_238._12_4_,CONCAT22(local_238._10_2_,local_238._8_2_));
  if (plVar14 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar1 = (int *)((long)plVar14 + 0xc);
      iVar13 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
    }
    else {
      iVar13 = *(int *)((long)plVar14 + 0xc);
      *(int *)((long)plVar14 + 0xc) = iVar13 + -1;
    }
    if (iVar13 == 1) {
      (**(code **)(*plVar14 + 0x18))();
    }
  }
  local_140.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(_Atomic_word *)((long)local_1f0 + 8) = *(_Atomic_word *)((long)local_1f0 + 8) + 1;
    UNLOCK();
  }
  else {
    *(_Atomic_word *)((long)local_1f0 + 8) = *(_Atomic_word *)((long)local_1f0 + 8) + 1;
  }
  local_140.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Alarm *)(p_Var15 + 1);
  Poll::subscribe_alarm(poll,&local_140);
  if (local_140.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_188._M_unused._M_object = &local_178;
  local_188._8_8_ = 0;
  local_178 = 0;
  uVar5 = (complex->header).cmd_seq;
  local_160 = (_Manager_type *)&local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"CAN_ADD","");
  iVar13 = TCPServer::get_port(local_1b8);
  if (local_160 == (_Manager_type *)&local_150) {
    pcStack_1d0 = pcStack_148;
    local_1e8._M_unused._M_object = &local_1d8;
  }
  else {
    local_1e8._M_unused._M_object = local_160;
  }
  local_1d8 = (_Manager_type)CONCAT71(uStack_14f,local_150);
  local_1e8._8_8_ = local_158;
  local_158 = 0;
  local_150 = 0;
  local_218 = &uStack_208;
  local_238._10_2_ = 0;
  local_238._12_4_ = 0;
  local_238._16_2_ = 0;
  local_238._18_2_ = 0;
  local_238._20_4_ = 0;
  local_238._24_2_ = 0;
  local_210 = 0;
  uStack_208 = 0;
  local_238[8] = '\0';
  local_238[9] = '\0';
  local_238._0_8_ = (pointer)0x0;
  local_160 = (_Manager_type *)&local_150;
  local_100 = poll;
  std::__cxx11::string::operator=((string *)&local_218,(string *)local_188._M_pod_data);
  uVar11 = local_1e8._M_unused._0_8_;
  strcpy(local_238,(char *)local_1e8._M_unused._0_8_);
  local_238._10_2_ = (undefined2)uVar5;
  local_238._12_4_ = (undefined4)(uVar5 >> 0x10);
  local_238._16_2_ = (undefined2)(uVar5 >> 0x30);
  if ((_Manager_type *)uVar11 != &local_1d8) {
    operator_delete((void *)uVar11,(ulong)(local_1d8 + 1));
  }
  local_238._18_2_ = (undefined2)iVar13;
  local_238._20_4_ = SEXT24((short)((uint)iVar13 >> 0x10));
  local_238._24_2_ = (undefined2)(iVar13 >> 0x1f);
  if (local_160 != (_Manager_type *)&local_150) {
    operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
  }
  p_Var10 = local_1c0;
  this_01 = local_1f0;
  local_78._18_8_ = CONCAT26(local_238._24_2_,CONCAT42(local_238._20_4_,local_238._18_2_));
  local_78._16_2_ = local_238._16_2_;
  local_78._0_4_ = local_238._0_4_;
  local_78._4_4_ = local_238._4_4_;
  local_78._8_2_ = local_238._8_2_;
  local_78._10_2_ = local_238._10_2_;
  local_78._12_4_ = local_238._12_4_;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_218,local_218 + local_210);
  respond<dto::Complex>(local_168,local_100,(Complex *)local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"UDPServer: created file upload tcp server listening on port ",
             0x3c);
  iVar13 = TCPServer::get_port(local_1b8);
  plVar14 = (long *)std::ostream::operator<<(&std::cout,iVar13);
  std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
  std::ostream::put((char)plVar14);
  std::ostream::flush();
  if (local_218 != &uStack_208) {
    operator_delete(local_218,CONCAT71(uStack_207,uStack_208) + 1);
  }
  if ((undefined1 *)local_188._M_unused._0_8_ != &local_178) {
    operator_delete(local_188._M_unused._M_object,CONCAT71(uStack_177,local_178) + 1);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &local_1c8->_M_weak_count;
      iVar13 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar13 = local_1c8->_M_weak_count;
      local_1c8->_M_weak_count = iVar13 + -1;
    }
    if (iVar13 == 1) {
      (*local_1c8->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_1b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0._M_pi);
  }
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
LAB_00124c49:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void UDPServer::on_upload(Poll &poll, dto::Complex &complex) {
  std::string file_name = complex.payload;
  if (!dir->can_create_file(complex.header.param, file_name)) {
    auto dto = dto::create(complex.header.cmd_seq, "NO_WAY", file_name);
    respond(poll, dto);
    return;
  }
  dir->reserve_file(file_name, complex.header.param);
  std::shared_ptr<SharedDirectory> sdir = this->dir;

  auto tcp = std::make_shared<TCPServer>(
      std::string("FileUploadServer-") + file_name,
      FileReceiveSession::create_session_factory(dir->path_in_dir(file_name))
  );
  poll.subscribe(tcp);
  std::weak_ptr<TCPServer> server = tcp;
  auto alarm = std::make_shared<Alarm>(timeout * 1000, [server, &poll, file_name, sdir]() -> void {
    if (!server.expired()) {
      poll.unsubscribe(*server.lock());
      sdir->cancel_reserved_file(file_name);
    }
  });
  poll.subscribe_alarm(alarm);
  std::string nil;
  auto ok = dto::create(complex.header.cmd_seq, "CAN_ADD", nil, tcp->get_port());
  respond(poll, ok);
  std::cout << "UDPServer: created file upload tcp server listening on port " << tcp->get_port() << std::endl;
}